

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O0

void __thiscall
iu_FooP_x_iutest_x_DISABLED_Bar_Test::Body(iu_FooP_x_iutest_x_DISABLED_Bar_Test *this)

{
  ParamType *pPVar1;
  Fixed *fixed;
  AssertionHelper local_1e0;
  Fixed local_1a0;
  ParamType local_14;
  iu_FooP_x_iutest_x_DISABLED_Bar_Test *piStack_10;
  int v;
  iu_FooP_x_iutest_x_DISABLED_Bar_Test *this_local;
  
  piStack_10 = this;
  pPVar1 = iutest::WithParamInterface<int>::GetParam();
  local_14 = *pPVar1;
  memset(&local_1a0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1a0);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1a0,local_14);
  iutest::AssertionHelper::AssertionHelper
            (&local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/disabled_tests_decl.cpp"
             ,0x38,"Failed.\n",kFatalFailure);
  iutest::AssertionHelper::operator=(&local_1e0,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_1e0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1a0);
  return;
}

Assistant:

IUTEST_P(FooP, DISABLED_Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}